

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

ngx_int_t ngx_atofp(u_char *line,size_t n,size_t point)

{
  long local_48;
  ngx_uint_t dot;
  ngx_int_t cutlim;
  ngx_int_t cutoff;
  ngx_int_t value;
  size_t point_local;
  size_t n_local;
  u_char *line_local;
  
  if (n == 0) {
    line_local = (u_char *)0xffffffffffffffff;
  }
  else {
    local_48 = 0;
    cutoff = 0;
    value = point;
    point_local = n;
    n_local = (size_t)line;
    while (point_local != 0) {
      if (value == 0) {
        return -1;
      }
      if (*(char *)n_local == '.') {
        if (local_48 != 0) {
          return -1;
        }
        local_48 = 1;
      }
      else {
        if ((*(byte *)n_local < 0x30) || (0x39 < *(byte *)n_local)) {
          return -1;
        }
        if ((0xccccccccccccccb < cutoff) &&
           ((0xccccccccccccccc < cutoff || (7 < (int)(*(byte *)n_local - 0x30))))) {
          return -1;
        }
        cutoff = cutoff * 10 + (long)(int)(*(byte *)n_local - 0x30);
        value = value - local_48;
      }
      n_local = n_local + 1;
      point_local = point_local - 1;
    }
    while (value != 0) {
      if (0xccccccccccccccc < cutoff) {
        return -1;
      }
      cutoff = cutoff * 10;
      value = value + -1;
    }
    line_local = (u_char *)cutoff;
  }
  return (ngx_int_t)line_local;
}

Assistant:

ngx_int_t
ngx_atofp(u_char *line, size_t n, size_t point)
{
    ngx_int_t   value, cutoff, cutlim;
    ngx_uint_t  dot;

    if (n == 0) {
        return NGX_ERROR;
    }

    cutoff = NGX_MAX_INT_T_VALUE / 10;
    cutlim = NGX_MAX_INT_T_VALUE % 10;

    dot = 0;

    for (value = 0; n--; line++) {

        if (point == 0) {
            return NGX_ERROR;
        }

        if (*line == '.') {
            if (dot) {
                return NGX_ERROR;
            }

            dot = 1;
            continue;
        }

        if (*line < '0' || *line > '9') {
            return NGX_ERROR;
        }

        if (value >= cutoff && (value > cutoff || *line - '0' > cutlim)) {
            return NGX_ERROR;
        }

        value = value * 10 + (*line - '0');
        point -= dot;
    }

    while (point--) {
        if (value > cutoff) {
            return NGX_ERROR;
        }

        value = value * 10;
    }

    return value;
}